

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_mem.c
# Opt level: O0

void zt_mem_heap_destroy(zt_mem_heap **heap)

{
  long *in_RDI;
  
  if (in_RDI != (long *)0x0) {
    (*GLOBAL_zmt.dealloc)(*(void **)*in_RDI);
    *(undefined8 *)*in_RDI = 0;
    *(undefined8 *)(*in_RDI + 8) = 0;
    (*GLOBAL_zmt.dealloc)((void *)*in_RDI);
    *in_RDI = 0;
  }
  return;
}

Assistant:

void
zt_mem_heap_destroy(zt_mem_heap **heap)
{
    if (!heap) {
        return;
    }

    GLOBAL_zmt.dealloc((*heap)->name);
    (*heap)->name = 0;
    (*heap)->size = 0;

    GLOBAL_zmt.dealloc(*heap);
    *heap = 0;
}